

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O1

void resize_getline(gamewin *gw)

{
  WINDOW *pWVar1;
  int iVar2;
  int iVar3;
  
  pWVar1 = gw->win;
  iVar2 = -1;
  iVar3 = -1;
  if (pWVar1 != (WINDOW *)0x0) {
    iVar3 = pWVar1->_maxy + 1;
    iVar2 = pWVar1->_maxx + 1;
  }
  if (_LINES <= iVar3) {
    iVar3 = _LINES;
  }
  if (_COLS <= iVar2) {
    iVar2 = _COLS;
  }
  mvwin(pWVar1,(_LINES - iVar3) / 2,(_COLS - iVar2) / 2);
  wresize(gw->win,iVar3,iVar2);
  return;
}

Assistant:

static void resize_getline(struct gamewin *gw)
{
    int height, width, startx, starty;
    
    getmaxyx(gw->win, height, width);
    if (height > LINES) height = LINES;
    if (width > COLS) width = COLS;
    
    starty = (LINES - height) / 2;
    startx = (COLS - width) / 2;
    
    mvwin(gw->win, starty, startx);
    wresize(gw->win, height, width);
}